

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O3

HRESULT __thiscall Js::SCAPropBag::Add(SCAPropBag *this,LPCWSTR name,Var value)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  BOOL BVar4;
  size_t sVar5;
  undefined4 *puVar6;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  AutoHandledExceptionType __autoHandledExceptionType;
  
  scriptContext = (this->super_ScriptContextHolder).m_scriptContext;
  AutoHandledExceptionType::AutoHandledExceptionType
            ((AutoHandledExceptionType *)((long)&__enterScriptObject.library + 7),
             ExceptionType_JavascriptException|ExceptionType_StackOverflow|ExceptionType_OutOfMemory
            );
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_98 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_58,scriptContext,(ScriptEntryExitRecord *)auStack_98,
             unaff_retaddr,&stack0x00000000,false,false,false);
  ScriptContext::OnScriptStart(scriptContext,false,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
  sVar5 = PAL_wcslen(name);
  HVar3 = InternalAdd(this,name,(charcount_t)sVar5,value);
  EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
  BVar4 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCAPropBag.cpp"
                                ,0x5d,
                                "(!JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                                "!JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  AutoHandledExceptionType::~AutoHandledExceptionType
            ((AutoHandledExceptionType *)((long)&__enterScriptObject.library + 7));
  return HVar3;
}

Assistant:

HRESULT SCAPropBag::Add(LPCWSTR name, Var value)
    {
        HRESULT hr = S_OK;
        ScriptContext* scriptContext = GetScriptContext();

        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT
        {
            BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false)
            {
                charcount_t len;
                IfFailGo(SizeTToUInt(wcslen(name), &len));
                IfFailGo(InternalAdd(name, len, value));
Error:
                ; // Fall through
            }
            END_JS_RUNTIME_CALL(scriptContext);
        }